

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::UsubBorrowCaseInstance::getInputValues
          (UsubBorrowCaseInstance *this,int numValues,void **values)

{
  ShaderType shaderType;
  DataType dataType;
  uint uVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  deUint32 dVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int numValues_00;
  long lVar13;
  int iVar14;
  bool bVar15;
  Random rnd;
  
  dVar6 = deStringHash((this->super_IntegerFunctionTestInstance).m_name);
  deRandom_init(&rnd.m_rnd,dVar6 ^ 0x235fac);
  pSVar2 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  shaderType = (pSVar2->varType).m_data.basic.type;
  dataType = *(DataType *)((long)&(pSVar2->varType).m_data + 4);
  uVar7 = glu::getDataTypeScalarSize(shaderType);
  bVar8 = (char)*(undefined4 *)(&DAT_009f53e8 + (ulong)dataType * 4) - 1;
  uVar11 = (2 << (bVar8 & 0x1f)) - 1;
  pvVar3 = *values;
  pvVar4 = values[1];
  numValues_00 = 0;
  uVar9 = 0;
  if (0 < (int)uVar7) {
    uVar9 = (ulong)uVar7;
  }
  for (lVar13 = 0; uVar10 = uVar9, iVar14 = numValues_00, lVar13 != 6; lVar13 = lVar13 + 1) {
    while (bVar15 = uVar10 != 0, uVar10 = uVar10 - 1, bVar15) {
      *(uint *)((long)pvVar3 + (long)iVar14 * 4) = (&DAT_009f5440)[lVar13 * 2] & uVar11;
      *(uint *)((long)pvVar4 + (long)iVar14 * 4) = (&DAT_009f5444)[lVar13 * 2] & uVar11;
      iVar14 = iVar14 + 1;
    }
    numValues_00 = numValues_00 + uVar7;
  }
  if (shaderType - 0x1b < 4) {
    uVar11 = 1 << (bVar8 & 0x1f);
    iVar14 = 0;
    for (iVar12 = 0; uVar10 = uVar9, iVar5 = iVar14, iVar12 != 6; iVar12 = iVar12 + 1) {
      while (uVar10 != 0) {
        lVar13 = (long)iVar5;
        uVar1 = *(uint *)((long)pvVar3 + lVar13 * 4);
        *(uint *)((long)pvVar3 + lVar13 * 4) = (uVar1 & uVar11) * -2 | uVar1;
        uVar1 = *(uint *)((long)pvVar4 + lVar13 * 4);
        *(uint *)((long)pvVar4 + lVar13 * 4) = (uVar1 & uVar11) * -2 | uVar1;
        uVar10 = uVar10 - 1;
        iVar5 = iVar5 + 1;
      }
      iVar14 = iVar14 + uVar7;
      numValues_00 = iVar5;
    }
  }
  shaderexecutor::anon_unknown_0::generateRandomInputData
            (&rnd,shaderType,dataType,(Precision)pvVar3,(deUint32 *)(ulong)(numValues - 6U),
             numValues_00);
  shaderexecutor::anon_unknown_0::generateRandomInputData
            (&rnd,shaderType,dataType,(Precision)pvVar4,(deUint32 *)(ulong)(numValues - 6U),
             numValues_00);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(m_name) ^ 0x235facu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			integerMask		= getLowBitMask(integerLength);
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		deUint32*				in0				= (deUint32*)values[0];
		deUint32*				in1				= (deUint32*)values[1];

		const struct
		{
			deUint32	x;
			deUint32	y;
		} easyCases[] =
		{
			{ 0x00000000u,	0x00000000u },
			{ 0x00000001u,	0x00000001u },
			{ 0x00000001u,	0x00000002u },
			{ 0x00000001u,	0xffffffffu },
			{ 0xfffffffeu,	0xffffffffu },
			{ 0xffffffffu,	0xffffffffu },
		};

		// generate integers with proper bit count
		for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				in0[easyCaseNdx*scalarSize + compNdx] = easyCases[easyCaseNdx].x & integerMask;
				in1[easyCaseNdx*scalarSize + compNdx] = easyCases[easyCaseNdx].y & integerMask;
			}
		}

		// convert to signed
		if (isSigned)
		{
			for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					in0[easyCaseNdx*scalarSize + compNdx] = extendSignTo32(in0[easyCaseNdx*scalarSize + compNdx], integerLength);
					in1[easyCaseNdx*scalarSize + compNdx] = extendSignTo32(in1[easyCaseNdx*scalarSize + compNdx], integerLength);
				}
			}
		}

		generateRandomInputData(rnd, m_shaderType, type, precision, in0, numValues - DE_LENGTH_OF_ARRAY(easyCases));
		generateRandomInputData(rnd, m_shaderType, type, precision, in1, numValues - DE_LENGTH_OF_ARRAY(easyCases));
	}